

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkAssignIDs(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *pVVar1;
  long lVar2;
  Vec_Ptr_t *pVVar3;
  
  pVVar1 = Abc_NtkDfs(pNtk,0);
  Abc_NtkCleanCopy(pNtk);
  pVVar3 = pNtk->vCis;
  if (0 < pVVar3->nSize) {
    lVar2 = 0;
    do {
      *(int *)((long)pVVar3->pArray[lVar2] + 0x40) = (int)lVar2;
      lVar2 = lVar2 + 1;
      pVVar3 = pNtk->vCis;
    } while (lVar2 < pVVar3->nSize);
  }
  if (0 < pVVar1->nSize) {
    lVar2 = 0;
    do {
      *(int *)((long)pVVar1->pArray[lVar2] + 0x40) = pNtk->vCis->nSize + (int)lVar2;
      lVar2 = lVar2 + 1;
    } while (lVar2 < pVVar1->nSize);
  }
  pVVar3 = pNtk->vCos;
  if (0 < pVVar3->nSize) {
    lVar2 = 0;
    do {
      *(int *)((long)pVVar3->pArray[lVar2] + 0x40) = pNtk->vCis->nSize + pVVar1->nSize + (int)lVar2;
      lVar2 = lVar2 + 1;
      pVVar3 = pNtk->vCos;
    } while (lVar2 < pVVar3->nSize);
  }
  return pVVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////
 
////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Ptr_t * Abc_NtkAssignIDs( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = i;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        pObj->iTemp = Abc_NtkCiNum(pNtk) + i;
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->iTemp = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + i;
    return vNodes;
}